

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binder.cpp
# Opt level: O2

BoundStatement * __thiscall
duckdb::Binder::BindWithCTE<duckdb::InsertStatement>
          (BoundStatement *__return_storage_ptr__,Binder *this,InsertStatement *statement)

{
  shared_ptr<duckdb::Binder,_true> *this_00;
  pointer pCVar1;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var2;
  _Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_> _Var3;
  type pBVar4;
  pointer pBVar5;
  Binder *pBVar6;
  InsertStatement *pIVar7;
  type other;
  pointer *__ptr;
  CorrelatedColumnInfo *c;
  pointer info;
  undefined1 local_78 [16];
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_68;
  
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (__return_storage_ptr__->types).
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  SQLStatement::Cast<duckdb::InsertStatement>(&statement->super_SQLStatement);
  BindMaterializedCTE((Binder *)local_78,(CommonTableExpressionMap *)this);
  if ((element_type *)local_78._0_8_ == (element_type *)0x0) {
    pIVar7 = SQLStatement::Cast<duckdb::InsertStatement>(&statement->super_SQLStatement);
    Bind((BoundStatement *)&stack0xffffffffffffff98,this,pIVar7);
    BoundStatement::operator=(__return_storage_ptr__,(BoundStatement *)&stack0xffffffffffffff98);
    BoundStatement::~BoundStatement((BoundStatement *)&stack0xffffffffffffff98);
  }
  else {
    pBVar4 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
             operator*((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)local_78);
    while ((pBVar4->child).
           super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>.
           _M_t.
           super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
           .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl !=
           (BoundQueryNode *)0x0) {
      pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator->(&pBVar4->child);
      if (pBVar5->type != CTE_NODE) break;
      pBVar5 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator->(&pBVar4->child);
      pBVar4 = BoundQueryNode::Cast<duckdb::BoundCTENode>(pBVar5);
    }
    this_00 = &pBVar4->child_binder;
    pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
    pIVar7 = SQLStatement::Cast<duckdb::InsertStatement>(&statement->super_SQLStatement);
    Bind((BoundStatement *)&stack0xffffffffffffff98,pBVar6,pIVar7);
    BoundStatement::operator=(__return_storage_ptr__,(BoundStatement *)&stack0xffffffffffffff98);
    BoundStatement::~BoundStatement((BoundStatement *)&stack0xffffffffffffff98);
    ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::operator=
              (&(pBVar4->super_BoundQueryNode).types.
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>,
               &(__return_storage_ptr__->types).
                super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&(pBVar4->super_BoundQueryNode).names,
                &(__return_storage_ptr__->names).
                 super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               );
    pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(&pBVar4->query_binder);
    pCVar1 = (pBVar6->correlated_columns).
             super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             .
             super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (info = (pBVar6->correlated_columns).
                super_vector<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                .
                super__Vector_base<duckdb::CorrelatedColumnInfo,_std::allocator<duckdb::CorrelatedColumnInfo>_>
                ._M_impl.super__Vector_impl_data._M_start; info != pCVar1; info = info + 1) {
      pBVar6 = shared_ptr<duckdb::Binder,_true>::operator->(this_00);
      AddCorrelatedColumn(pBVar6,info);
    }
    other = shared_ptr<duckdb::Binder,_true>::operator*(this_00);
    MoveCorrelatedExpressions(this,other);
    _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
    pBVar4 = unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>::
             operator*((unique_ptr<duckdb::BoundCTENode,_std::default_delete<duckdb::BoundCTENode>,_true>
                        *)local_78);
    local_78._8_8_ = _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    CreatePlan((Binder *)&stack0xffffffffffffff98,(BoundCTENode *)this,
               (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                *)pBVar4);
    _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)
         (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)local_68._M_head_impl;
    local_68._M_head_impl = (LogicalOperator *)0x0;
    _Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl =
         (__return_storage_ptr__->plan).
         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
         _M_t.
         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
         ._M_t.
         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>;
    (__return_storage_ptr__->plan).
    super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
    super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
    _M_t.
    super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
    .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
         _Var3.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
    if (_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl !=
        (LogicalOperator *)0x0) {
      (**(code **)(*(long *)_Var2.super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>.
                            _M_head_impl + 8))();
      if ((_Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
           )local_68._M_head_impl != (LogicalOperator *)0x0) {
        (**(code **)(*(long *)local_68._M_head_impl + 8))();
      }
    }
    local_68._M_head_impl = (LogicalOperator *)0x0;
    if ((LogicalOperator *)local_78._8_8_ != (LogicalOperator *)0x0) {
      (*(*(_func_int ***)local_78._8_8_)[1])();
    }
    local_78._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  if ((_Tuple_impl<0UL,_duckdb::BoundCTENode_*,_std::default_delete<duckdb::BoundCTENode>_>)
      local_78._0_8_ != (BoundCTENode *)0x0) {
    (**(code **)(*(long *)local_78._0_8_ + 8))();
  }
  return __return_storage_ptr__;
}

Assistant:

BoundStatement Binder::BindWithCTE(T &statement) {
	BoundStatement bound_statement;
	auto bound_cte = BindMaterializedCTE(statement.template Cast<T>().cte_map);
	if (bound_cte) {
		reference<BoundCTENode> tail_ref = *bound_cte;

		while (tail_ref.get().child && tail_ref.get().child->type == QueryNodeType::CTE_NODE) {
			tail_ref = tail_ref.get().child->Cast<BoundCTENode>();
		}

		auto &tail = tail_ref.get();
		bound_statement = tail.child_binder->Bind(statement.template Cast<T>());

		tail.types = bound_statement.types;
		tail.names = bound_statement.names;

		for (auto &c : tail.query_binder->correlated_columns) {
			tail.child_binder->AddCorrelatedColumn(c);
		}
		MoveCorrelatedExpressions(*tail.child_binder);

		auto plan = std::move(bound_statement.plan);
		bound_statement.plan = CreatePlan(*bound_cte, std::move(plan));
	} else {
		bound_statement = Bind(statement.template Cast<T>());
	}
	return bound_statement;
}